

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O0

boolean check_tutorial_message(int msgnum)

{
  boolean local_9;
  int msgnum_local;
  
  if (flags.tutorial == '\0') {
    local_9 = '\0';
  }
  else if (pl_tutorial[msgnum + -0xc9] < '\x01') {
    pl_tutorial[msgnum + -0xc9] = '\x01';
    if (msgnum == 0xca) {
      pl_tutorial[2] = '\x01';
    }
    else if (msgnum == 0x105) {
      pl_tutorial[0x3b] = '\x01';
    }
    else if (msgnum == 0x108) {
      pl_tutorial[0x3e] = '\x01';
    }
    else if (msgnum == 0x10a) {
      pl_tutorial[0x40] = '\x01';
    }
    tutorial_latest_message = msgnum;
    com_pager(msgnum);
    local_9 = '\x01';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

boolean check_tutorial_message(int msgnum)
{
	if (!flags.tutorial) return FALSE;
	if (pl_tutorial[msgnum - QT_T_FIRST] > 0) return FALSE;

	pl_tutorial[msgnum - QT_T_FIRST] = 1;
	tutorial_latest_message = msgnum;

	/* Show matching vi-keys message in tutorial review menu
	   when a numpad tutorial message is shown. */
	switch (msgnum) {
	case QT_T_CURSOR_NUMPAD:
	    pl_tutorial[QT_T_CURSOR_VIKEYS - QT_T_FIRST] = 1;
	    break;
	case QT_T_FARMOVE_NUMPAD:
	    pl_tutorial[QT_T_FARMOVE_VIKEYS - QT_T_FIRST] = 1;
	    break;
	case QT_T_DIAGONALS_NUM:
	    pl_tutorial[QT_T_DIAGONALS_VI - QT_T_FIRST] = 1;
	    break;
	case QT_T_REPEAT_NUMPAD:
	    pl_tutorial[QT_T_REPEAT_VIKEYS - QT_T_FIRST] = 1;
	    break;
	}

	com_pager(msgnum);
	return TRUE;
}